

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

bool __thiscall OrPattern::isMatch(OrPattern *this,ParserWalker *walker)

{
  uint uVar1;
  size_type sVar2;
  const_reference ppDVar3;
  int local_24;
  int4 i;
  ParserWalker *walker_local;
  OrPattern *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::size(&this->orlist);
    if (sVar2 <= (ulong)(long)local_24) {
      return false;
    }
    ppDVar3 = std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::operator[]
                        (&this->orlist,(long)local_24);
    uVar1 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[7])(*ppDVar3,walker);
    if ((uVar1 & 1) != 0) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool OrPattern::isMatch(ParserWalker &walker) const

{
  for(int4 i=0;i<orlist.size();++i)
    if (orlist[i]->isMatch(walker))
      return true;
  return false;
}